

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlelement.c
# Opt level: O1

fourcc_t EBML_BufferToID(uint8_t *Buffer)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  
  uVar3 = 0;
  if (Buffer != (uint8_t *)0x0) {
    bVar1 = *Buffer;
    if ((char)bVar1 < '\0') {
      return (uint)bVar1;
    }
    if (bVar1 < 0x40) {
      if (bVar1 < 0x20) {
        if (bVar1 < 0x10) {
          return 0;
        }
        uVar3 = (uint)Buffer[2] << 8 | (uint)Buffer[1] << 0x10 | (uint)bVar1 << 0x18;
        lVar2 = 3;
      }
      else {
        uVar3 = (uint)bVar1 << 0x10 | (uint)Buffer[1] << 8;
        lVar2 = 2;
      }
    }
    else {
      uVar3 = (uint)bVar1 << 8;
      lVar2 = 1;
    }
    uVar3 = Buffer[lVar2] | uVar3;
  }
  return uVar3;
}

Assistant:

fourcc_t EBML_BufferToID(const uint8_t *Buffer)
{
    if (Buffer == NULL)
        return 0;
    if (Buffer[0] & 0x80)
        return (fourcc_t)Buffer[0];
    if (Buffer[0] & 0x40)
        return (fourcc_t)((Buffer[0] << 8) + Buffer[1]);
    if (Buffer[0] & 0x20)
        return (fourcc_t)((Buffer[0] << 16) + (Buffer[1] << 8) + Buffer[2]);
    if (Buffer[0] & 0x10)
        return (fourcc_t)((Buffer[0] << 24) + (Buffer[1] << 16) + (Buffer[2] << 8) + Buffer[3]);
    return 0;
}